

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::fix_momentum_velocity_verts
               (Mesh *mesh,
               vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs,Int comp
               )

{
  Mesh *mesh_00;
  bool bVar1;
  Int IVar2;
  uint ent_dim;
  allocator local_f9;
  Mesh *local_f8;
  int local_ec;
  Read<signed_char> comp_marks;
  Bytes new_marks;
  Read<signed_char> ent_marks;
  Write<signed_char> local_b0;
  string local_a0;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Read<signed_char> old_marks;
  Write<signed_char> local_40;
  
  ent_dim = 0;
  local_ec = (int)(char)(1 << ((byte)comp & 0x1f));
  local_f8 = mesh;
  while( true ) {
    mesh_00 = local_f8;
    IVar2 = Mesh::dim(local_f8);
    if (IVar2 < (int)ent_dim) break;
    mark_class_closures((Omega_h *)&ent_marks,mesh_00,ent_dim,class_pairs);
    Write<signed_char>::Write(&local_40,&ent_marks.write_);
    multiply_each_by<signed_char>
              ((Omega_h *)&comp_marks,(Read<signed_char> *)&local_40,(char)local_ec);
    Write<signed_char>::~Write(&local_40);
    std::__cxx11::string::string
              ((string *)&local_a0,"momentum_velocity_fixed",(allocator *)&old_marks);
    bVar1 = Mesh::has_tag(mesh_00,ent_dim,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_a0,"momentum_velocity_fixed",(allocator *)&new_marks);
      Mesh::get_array<signed_char>((Mesh *)&old_marks,(Int)local_f8,(string *)(ulong)ent_dim);
      std::__cxx11::string::~string((string *)&local_a0);
      Write<signed_char>::Write(&local_b0,(Write<signed_char> *)&old_marks);
      Write<signed_char>::Write(&local_60,&comp_marks.write_);
      bit_or_each((Omega_h *)&new_marks,(Bytes *)&local_b0,(Bytes *)&local_60);
      Write<signed_char>::~Write(&local_60);
      Write<signed_char>::~Write(&local_b0);
      std::__cxx11::string::string((string *)&local_a0,"momentum_velocity_fixed",&local_f9);
      Write<signed_char>::Write(&local_70,&new_marks.write_);
      Mesh::set_tag<signed_char>(local_f8,ent_dim,&local_a0,(Read<signed_char> *)&local_70,false);
      Write<signed_char>::~Write(&local_70);
      std::__cxx11::string::~string((string *)&local_a0);
      Write<signed_char>::~Write(&new_marks.write_);
      Write<signed_char>::~Write((Write<signed_char> *)&old_marks);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_a0,"momentum_velocity_fixed",(allocator *)&old_marks);
      Write<signed_char>::Write(&local_80,&comp_marks.write_);
      Mesh::add_tag<signed_char>(local_f8,ent_dim,&local_a0,1,(Read<signed_char> *)&local_80,false);
      Write<signed_char>::~Write(&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    Write<signed_char>::~Write(&comp_marks.write_);
    Write<signed_char>::~Write(&ent_marks.write_);
    ent_dim = ent_dim + 1;
  }
  return;
}

Assistant:

void fix_momentum_velocity_verts(
    Mesh* mesh, std::vector<ClassPair> const& class_pairs, Int comp) {
  for (Int ent_dim = VERT; ent_dim <= mesh->dim(); ++ent_dim) {
    auto ent_marks = mark_class_closures(mesh, ent_dim, class_pairs);
    auto comp_marks = multiply_each_by(ent_marks, I8(1 << comp));
    if (mesh->has_tag(ent_dim, "momentum_velocity_fixed")) {
      auto old_marks = mesh->get_array<I8>(ent_dim, "momentum_velocity_fixed");
      auto new_marks = bit_or_each(old_marks, comp_marks);
      mesh->set_tag(ent_dim, "momentum_velocity_fixed", new_marks);
    } else {
      mesh->add_tag(ent_dim, "momentum_velocity_fixed", 1, comp_marks);
    }
  }
}